

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_xmi.cpp
# Opt level: O0

void __thiscall iff_chunk::iff_chunk(iff_chunk *this,iff_chunk *p_in)

{
  iff_chunk *p_in_local;
  iff_chunk *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_data);
  std::vector<iff_chunk,_std::allocator<iff_chunk>_>::vector(&this->m_sub_chunks);
  *(undefined4 *)this->m_id = *(undefined4 *)p_in->m_id;
  *(undefined4 *)this->m_type = *(undefined4 *)p_in->m_type;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->m_data,&p_in->m_data)
  ;
  std::vector<iff_chunk,_std::allocator<iff_chunk>_>::operator=
            (&this->m_sub_chunks,&p_in->m_sub_chunks);
  return;
}

Assistant:

iff_chunk( const iff_chunk & p_in )
    {
        memcpy( m_id, p_in.m_id, sizeof( m_id ) );
        memcpy( m_type, p_in.m_type, sizeof( m_type ) );
        m_data = p_in.m_data;
        m_sub_chunks = p_in.m_sub_chunks;
    }